

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase349::run(TestCase349 *this)

{
  bool bVar1;
  RefOrVoid<kj::AsyncIoProvider> ioProvider;
  RefOrVoid<kj::AsyncIoStream> stream;
  MonotonicClock *clock;
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  *pOVar2;
  OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  *pOVar3;
  Connection *pCVar4;
  OutgoingRpcMessage *pOVar5;
  Own<capnp::IncomingRpcMessage,_std::nullptr_t> *pOVar6;
  OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t> *pOVar7;
  IncomingRpcMessage *pIVar8;
  socklen_t __len;
  ArrayDisposer *pAVar9;
  sockaddr *__addr;
  ReaderOptions receiveOptions;
  bool local_7ba;
  undefined1 auStack_7b8 [6];
  bool _kj_shouldLog_1;
  Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> local_7a0;
  Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> local_798;
  DebugExpression<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> local_788;
  undefined1 local_778 [8];
  DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>,_const_kj::None_&>
  _kjCondition_1;
  ReaderFor<capnp::rpc::Message> local_728;
  Which local_6f6 [2];
  bool local_6f1;
  undefined1 local_6f0 [7];
  bool _kj_shouldLog;
  ReaderFor<capnp::rpc::Message> local_6d0;
  Which local_69e [2];
  DebugExpression<capnp::rpc::Message::Which> local_69a;
  undefined1 local_698 [8];
  DebugComparison<capnp::rpc::Message::Which,_capnp::rpc::Message::Which> _kjCondition;
  SourceLocation local_668;
  Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> local_650;
  Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> local_648;
  undefined1 local_638 [8];
  OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t> _kj_result_1;
  undefined1 local_618 [8];
  Own<capnp::IncomingRpcMessage,_std::nullptr_t> reply;
  Builder local_600;
  BuilderFor<capnp::rpc::Message> local_5e8;
  undefined1 local_5c0 [8];
  Builder body;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> msg;
  Reader local_580;
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  _kj_result;
  undefined1 local_520 [8];
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  conn;
  Builder hostId;
  MallocMessageBuilder refMessage;
  undefined1 local_3e0 [8];
  TwoPartyVatNetwork network;
  undefined1 local_68 [8];
  PipeThread serverThread;
  int handleCount;
  int callCount;
  AsyncIoContext ioContext;
  TestCase349 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  kj::setupAsyncIo();
  serverThread.pipe.ptr._4_4_ = 0;
  serverThread.pipe.ptr._0_4_ = 0;
  ioProvider = kj::Own<kj::AsyncIoProvider,_std::nullptr_t>::operator*
                         ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)
                          &ioContext.lowLevelProvider.ptr);
  runServer((PipeThread *)local_68,ioProvider,(int *)((long)&serverThread.pipe.ptr + 4),
            (int *)&serverThread.pipe.ptr);
  stream = kj::Own<kj::AsyncIoStream,_std::nullptr_t>::operator*
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&serverThread.thread.ptr);
  refMessage.moreSegments.builder.disposer = (ArrayDisposer *)0x0;
  ReaderOptions::ReaderOptions((ReaderOptions *)&refMessage.moreSegments.builder.disposer);
  clock = kj::systemCoarseMonotonicClock();
  receiveOptions._8_8_ = 0;
  receiveOptions.traversalLimitInWords = (uint64_t)refMessage.moreSegments.builder.disposer;
  pAVar9 = refMessage.moreSegments.builder.disposer;
  TwoPartyVatNetwork::TwoPartyVatNetwork
            ((TwoPartyVatNetwork *)local_3e0,stream,CLIENT,receiveOptions,clock);
  __len = (socklen_t)pAVar9;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&hostId._builder.dataSize,0x80,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::rpc::twoparty::VatId>
            ((Builder *)&conn.ptr,(MessageBuilder *)&hostId._builder.dataSize);
  rpc::twoparty::VatId::Builder::setSide((Builder *)&conn.ptr,SERVER);
  rpc::twoparty::VatId::Builder::operator_cast_to_Reader(&local_580,(Builder *)&conn.ptr);
  TwoPartyVatNetwork::connect((TwoPartyVatNetwork *)local_550,(int)local_3e0,__addr,__len);
  kj::_::
  readMaybe<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>
            ((_ *)local_540,
             (Maybe<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
              *)local_550);
  kj::
  Maybe<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
  ::~Maybe((Maybe<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
            *)local_550);
  pOVar2 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_540);
  if (pOVar2 == (Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
                 *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&msg.ptr,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x16b,FAILED,"network.connect(hostId) != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)&msg.ptr);
  }
  pOVar3 = kj::
           mv<kj::_::OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>
                     ((OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
                       *)local_540);
  kj::_::
  OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  ::OwnOwn((OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
            *)&_kj_result.value.ptr,pOVar3);
  kj::_::
  OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  ::~OwnOwn((OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
             *)local_540);
  pOVar2 = kj::_::
           OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
           ::operator*((OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
                        *)&_kj_result.value.ptr);
  kj::
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  ::Own((Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
         *)local_520,pOVar2);
  kj::_::
  OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  ::~OwnOwn((OwnOwn<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
             *)&_kj_result.value.ptr);
  pCVar4 = kj::
           Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
           ::operator->((Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
                         *)local_520);
  (*(pCVar4->super_Connection)._vptr_Connection[5])(pCVar4,0);
  pCVar4 = kj::
           Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
           ::operator->((Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
                         *)local_520);
  (**(pCVar4->super_Connection)._vptr_Connection)(&body._builder.dataSize,pCVar4,0x80);
  pOVar5 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                     ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)&body._builder.dataSize);
  (**pOVar5->_vptr_OutgoingRpcMessage)(&local_600);
  AnyPointer::Builder::initAs<capnp::rpc::Message>(&local_5e8,&local_600);
  rpc::Message::Builder::initReturn((Builder *)local_5c0,&local_5e8);
  rpc::Return::Builder::setAnswerId((Builder *)local_5c0,0x4d2);
  rpc::Return::Builder::setCanceled((Builder *)local_5c0);
  pOVar5 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                     ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)&body._builder.dataSize);
  (*pOVar5->_vptr_OutgoingRpcMessage[2])();
  kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::~Own
            ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)&body._builder.dataSize);
  pCVar4 = kj::
           Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
           ::operator->((Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
                         *)local_520);
  (*(pCVar4->super_Connection)._vptr_Connection[1])(&local_650);
  kj::SourceLocation::SourceLocation
            (&local_668,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
             ,&DAT_009b6b8e,0x178,0x5c);
  kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::wait
            ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)&local_648,
             &local_650);
  kj::_::readMaybe<capnp::IncomingRpcMessage,decltype(nullptr)>((_ *)local_638,&local_648);
  kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::~Maybe(&local_648);
  kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::~Promise(&local_650)
  ;
  pOVar6 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_638);
  if (pOVar6 == (Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&_kjCondition.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x178,FAILED,"conn->receiveIncomingMessage().wait(ioContext.waitScope) != nullptr",
               "");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition.result);
  }
  pOVar7 = kj::mv<kj::_::OwnOwn<capnp::IncomingRpcMessage,decltype(nullptr)>>
                     ((OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t> *)local_638);
  kj::_::OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t>::OwnOwn
            ((OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t> *)&_kj_result_1.value.ptr,pOVar7);
  kj::_::OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t> *)local_638);
  pOVar6 = kj::_::OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t>::operator*
                     ((OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t> *)&_kj_result_1.value.ptr);
  kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::Own
            ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)local_618,pOVar6);
  kj::_::OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<capnp::IncomingRpcMessage,_std::nullptr_t> *)&_kj_result_1.value.ptr);
  local_69e[1] = 1;
  local_69a = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_69e + 1);
  pIVar8 = kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::operator->
                     ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)local_618);
  (**pIVar8->_vptr_IncomingRpcMessage)(local_6f0);
  AnyPointer::Reader::getAs<capnp::rpc::Message>(&local_6d0,(Reader *)local_6f0);
  local_69e[0] = rpc::Message::Reader::which(&local_6d0);
  kj::_::DebugExpression<capnp::rpc::Message::Which>::operator==
            ((DebugComparison<capnp::rpc::Message::Which,_capnp::rpc::Message::Which> *)local_698,
             &local_69a,local_69e);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_698);
  if (!bVar1) {
    local_6f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_6f1 != false) {
      local_6f6[1] = 1;
      pIVar8 = kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::operator->
                         ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)local_618);
      (**pIVar8->_vptr_IncomingRpcMessage)(&_kjCondition_1.result);
      AnyPointer::Reader::getAs<capnp::rpc::Message>(&local_728,(Reader *)&_kjCondition_1.result);
      local_6f6[0] = rpc::Message::Reader::which(&local_728);
      kj::_::Debug::
      log<char_const(&)[91],kj::_::DebugComparison<capnp::rpc::Message::Which,capnp::rpc::Message::Which>&,capnp::rpc::Message::Which,capnp::rpc::Message::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x179,ERROR,
                 "\"failed: expected \" \"(rpc::Message::ABORT) == (reply->getBody().getAs<rpc::Message>().which())\", _kjCondition, rpc::Message::ABORT, reply->getBody().getAs<rpc::Message>().which()"
                 ,(char (*) [91])
                  "failed: expected (rpc::Message::ABORT) == (reply->getBody().getAs<rpc::Message>().which())"
                 ,(DebugComparison<capnp::rpc::Message::Which,_capnp::rpc::Message::Which> *)
                  local_698,local_6f6 + 1,local_6f6);
      local_6f1 = false;
    }
  }
  kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::~Own
            ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)local_618);
  pCVar4 = kj::
           Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
           ::operator->((Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
                         *)local_520);
  (*(pCVar4->super_Connection)._vptr_Connection[1])(&local_7a0);
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)auStack_7b8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
             ,&DAT_009b6b8e,0x17c,0x53);
  kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::wait
            ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)&local_798,
             &local_7a0);
  kj::_::DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_788,
             (Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> *)&kj::_::MAGIC_ASSERT);
  kj::_::DebugExpression<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>>::
  operator==((DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>,_const_kj::None_&>
              *)local_778,
             (DebugExpression<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>> *)
             &local_788,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
  ~DebugExpression(&local_788);
  kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::~Maybe(&local_798);
  kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::~Promise(&local_7a0)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_778);
  if (!bVar1) {
    local_7ba = kj::_::Debug::shouldLog(ERROR);
    while (local_7ba != false) {
      kj::_::Debug::
      log<char_const(&)[86],kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x17c,ERROR,
                 "\"failed: expected \" \"conn->receiveIncomingMessage().wait(ioContext.waitScope) == kj::none\", _kjCondition"
                 ,(char (*) [86])
                  "failed: expected conn->receiveIncomingMessage().wait(ioContext.waitScope) == kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>,_const_kj::None_&>
                   *)local_778);
      local_7ba = false;
    }
  }
  kj::_::
  DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>,_const_kj::None_&>
  ::~DebugComparison((DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>,_const_kj::None_&>
                      *)local_778);
  kj::
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  ::~Own((Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
          *)local_520);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&hostId._builder.dataSize);
  TwoPartyVatNetwork::~TwoPartyVatNetwork((TwoPartyVatNetwork *)local_3e0);
  kj::AsyncIoProvider::PipeThread::~PipeThread((PipeThread *)local_68);
  kj::AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&handleCount);
  return;
}

Assistant:

TEST(TwoPartyNetwork, Abort) {
  // Verify that aborts are received.

  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);

  MallocMessageBuilder refMessage(128);
  auto hostId = refMessage.initRoot<rpc::twoparty::VatId>();
  hostId.setSide(rpc::twoparty::Side::SERVER);

  auto conn = KJ_ASSERT_NONNULL(network.connect(hostId));
  conn->setIdle(false);

  {
    // Send an invalid message (Return to non-existent question).
    auto msg = conn->newOutgoingMessage(128);
    auto body = msg->getBody().initAs<rpc::Message>().initReturn();
    body.setAnswerId(1234);
    body.setCanceled();
    msg->send();
  }

  {
    auto reply = KJ_ASSERT_NONNULL(conn->receiveIncomingMessage().wait(ioContext.waitScope));
    EXPECT_EQ(rpc::Message::ABORT, reply->getBody().getAs<rpc::Message>().which());
  }

  EXPECT_TRUE(conn->receiveIncomingMessage().wait(ioContext.waitScope) == kj::none);
}